

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O3

void PushId(void)

{
  boolean bVar1;
  
  bVar1 = isvalidtype(oldtabindex);
  if (bVar1 != NO) {
    actionpush(oldtabindex);
    return;
  }
  printlexeme(oldtabindex);
  printf("%s on line %d\n"," is an invalid type",(ulong)(uint)linenum);
  exit(4);
}

Assistant:

void	PushId(void)
{
    if (!isvalidtype(oldtabindex))	{
        printlexeme(oldtabindex);
        error(" is an invalid type", linenum);
    }
    actionpush(oldtabindex);
}